

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O2

bool __thiscall
ssl_credential_st::SetLeafCert
          (ssl_credential_st *this,UniquePtr<CRYPTO_BUFFER> *leaf,bool discard_key_on_mismatch)

{
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> *this_00;
  SSLCredentialType SVar1;
  EVP_PKEY *privkey;
  crypto_buffer_st *value;
  UniquePtr<EVP_PKEY> __p;
  _Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false> __p_00;
  bool bVar2;
  int iVar3;
  CRYPTO_BUFFER *buf;
  OPENSSL_STACK *pOVar4;
  UniquePtr<EVP_PKEY> new_pubkey;
  _Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false> local_48;
  CBS cbs;
  
  bVar2 = UsesX509(this);
  if (!bVar2) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,0xd0);
    return false;
  }
  SVar1 = this->type;
  CRYPTO_BUFFER_init_CBS
            ((leaf->_M_t).super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl,&cbs);
  bssl::ssl_cert_parse_pubkey((bssl *)&new_pubkey,&cbs);
  if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
      new_pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
LAB_0014bcd8:
    bVar2 = false;
  }
  else {
    iVar3 = EVP_PKEY_id((EVP_PKEY *)
                        new_pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
    bVar2 = bssl::ssl_is_key_type_supported(iVar3);
    iVar3 = 0xde;
    if (!bVar2) {
LAB_0014bcdc:
      bVar2 = false;
      ERR_put_error(0x10,0,0xe4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                    ,iVar3);
      goto LAB_0014bcf4;
    }
    iVar3 = EVP_PKEY_id((EVP_PKEY *)
                        new_pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
    if (iVar3 == 0x198) {
      bVar2 = bssl::ssl_cert_check_key_usage(&cbs,key_usage_digital_signature);
      iVar3 = 0xe6;
      if (!bVar2) goto LAB_0014bcdc;
    }
    if (((SVar1 != kDelegated) &&
        (privkey = (this->privkey)._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
        privkey != (EVP_PKEY *)0x0)) &&
       (bVar2 = bssl::ssl_compare_public_and_private_key
                          ((EVP_PKEY *)
                           new_pubkey._M_t.
                           super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,privkey), !bVar2
       )) {
      if (!discard_key_on_mismatch) goto LAB_0014bcd8;
      ERR_clear_error();
      std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)&this->privkey,
                 (pointer)0x0);
    }
    this_00 = &this->chain;
    pOVar4 = (OPENSSL_STACK *)
             (this->chain)._M_t.
             super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
    if (pOVar4 == (OPENSSL_STACK *)0x0) {
      bssl::new_leafless_chain();
      __p_00._M_head_impl = local_48._M_head_impl;
      local_48._M_head_impl = (pointer)0x0;
      std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)this_00,
                 __p_00._M_head_impl);
      std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)&local_48);
      pOVar4 = (OPENSSL_STACK *)
               (this_00->_M_t).
               super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
      if (pOVar4 == (OPENSSL_STACK *)0x0) goto LAB_0014bcd8;
    }
    buf = (CRYPTO_BUFFER *)OPENSSL_sk_value(pOVar4,0);
    CRYPTO_BUFFER_free(buf);
    pOVar4 = (OPENSSL_STACK *)
             (this_00->_M_t).super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
    value = (leaf->_M_t).super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
    (leaf->_M_t).super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl = (crypto_buffer_st *)0x0;
    OPENSSL_sk_set(pOVar4,0,value);
    __p = new_pubkey;
    bVar2 = true;
    if (SVar1 != kDelegated) {
      new_pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
      std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)&this->pubkey,
                 (pointer)__p._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
    }
  }
LAB_0014bcf4:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&new_pubkey);
  return bVar2;
}

Assistant:

bool ssl_credential_st::SetLeafCert(UniquePtr<CRYPTO_BUFFER> leaf,
                                    bool discard_key_on_mismatch) {
  if (!UsesX509()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return false;
  }

  const bool private_key_matches_leaf = type != SSLCredentialType::kDelegated;

  CBS cbs;
  CRYPTO_BUFFER_init_CBS(leaf.get(), &cbs);
  UniquePtr<EVP_PKEY> new_pubkey = ssl_cert_parse_pubkey(&cbs);
  if (new_pubkey == nullptr) {
    return false;
  }

  if (!ssl_is_key_type_supported(EVP_PKEY_id(new_pubkey.get()))) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_CERTIFICATE_TYPE);
    return false;
  }

  // An ECC certificate may be usable for ECDH or ECDSA. We only support ECDSA
  // certificates, so sanity-check the key usage extension.
  if (EVP_PKEY_id(new_pubkey.get()) == EVP_PKEY_EC &&
      !ssl_cert_check_key_usage(&cbs, key_usage_digital_signature)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_CERTIFICATE_TYPE);
    return false;
  }

  if (private_key_matches_leaf && privkey != nullptr &&
      !ssl_compare_public_and_private_key(new_pubkey.get(), privkey.get())) {
    if (!discard_key_on_mismatch) {
      return false;
    }
    ERR_clear_error();
    privkey = nullptr;
  }

  if (chain == nullptr) {
    chain = new_leafless_chain();
    if (chain == nullptr) {
      return false;
    }
  }

  CRYPTO_BUFFER_free(sk_CRYPTO_BUFFER_value(chain.get(), 0));
  sk_CRYPTO_BUFFER_set(chain.get(), 0, leaf.release());
  if (private_key_matches_leaf) {
    pubkey = std::move(new_pubkey);
  }
  return true;
}